

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateNotationUse(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *notationName)

{
  xmlHashTablePtr pxVar1;
  void *pvVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((doc != (xmlDocPtr)0x0) &&
     (notationName != (xmlChar *)0x0 && doc->intSubset != (_xmlDtd *)0x0)) {
    pxVar1 = (xmlHashTablePtr)doc->intSubset->notations;
    if ((pxVar1 != (xmlHashTablePtr)0x0) &&
       (pvVar2 = xmlHashLookup(pxVar1,notationName), pvVar2 != (void *)0x0)) {
      return 1;
    }
    if (((doc->extSubset != (_xmlDtd *)0x0) &&
        (pxVar1 = (xmlHashTablePtr)doc->extSubset->notations, pxVar1 != (xmlHashTablePtr)0x0)) &&
       (pvVar2 = xmlHashLookup(pxVar1,notationName), pvVar2 != (void *)0x0)) {
      return 1;
    }
    iVar3 = 0;
    xmlDoErrValid(ctxt,(xmlNodePtr)doc,XML_DTD_UNKNOWN_NOTATION,2,notationName,(xmlChar *)0x0,
                  (xmlChar *)0x0,0,"NOTATION %s is not declared\n",notationName,0,0);
  }
  return iVar3;
}

Assistant:

int
xmlValidateNotationUse(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       const xmlChar *notationName) {
    xmlNotationPtr notaDecl;
    if ((doc == NULL) || (doc->intSubset == NULL) ||
        (notationName == NULL)) return(-1);

    notaDecl = xmlGetDtdNotationDesc(doc->intSubset, notationName);
    if ((notaDecl == NULL) && (doc->extSubset != NULL))
	notaDecl = xmlGetDtdNotationDesc(doc->extSubset, notationName);

    if (notaDecl == NULL) {
	xmlErrValidNode(ctxt, (xmlNodePtr) doc, XML_DTD_UNKNOWN_NOTATION,
	                "NOTATION %s is not declared\n",
		        notationName, NULL, NULL);
	return(0);
    }
    return(1);
}